

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapIterator<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>,_false>
::DenseMapIterator(DenseMapIterator<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>,_false>
                   *this,pointer Pos,pointer E,DebugEpochBase *Epoch,bool NoAdvance)

{
  bool bVar1;
  bool NoAdvance_local;
  DebugEpochBase *Epoch_local;
  pointer E_local;
  pointer Pos_local;
  DenseMapIterator<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>,_false>
  *this_local;
  
  DebugEpochBase::HandleBase::HandleBase((HandleBase *)this,Epoch);
  this->Ptr = Pos;
  this->End = E;
  bVar1 = DebugEpochBase::HandleBase::isHandleInSync((HandleBase *)this);
  if (bVar1) {
    if (!NoAdvance) {
      bVar1 = shouldReverseIterate<llbuild::core::KeyID>();
      if (bVar1) {
        RetreatPastEmptyBuckets(this);
      }
      else {
        AdvancePastEmptyBuckets(this);
      }
    }
    return;
  }
  __assert_fail("isHandleInSync() && \"invalid construction!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                ,0x46c,
                "llvm::DenseMapIterator<llbuild::core::KeyID, DBKeyID>::DenseMapIterator(pointer, pointer, const DebugEpochBase &, bool) [KeyT = llbuild::core::KeyID, ValueT = DBKeyID, KeyInfoT = llvm::DenseMapInfo<llbuild::core::KeyID>, Bucket = llvm::detail::DenseMapPair<llbuild::core::KeyID, DBKeyID>, IsConst = false]"
               );
}

Assistant:

DenseMapIterator(pointer Pos, pointer E, const DebugEpochBase &Epoch,
                   bool NoAdvance = false)
      : DebugEpochBase::HandleBase(&Epoch), Ptr(Pos), End(E) {
    assert(isHandleInSync() && "invalid construction!");

    if (NoAdvance) return;
    if (shouldReverseIterate<KeyT>()) {
      RetreatPastEmptyBuckets();
      return;
    }
    AdvancePastEmptyBuckets();
  }